

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

void ssl_cf_close(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 uVar1;
  Curl_cfilter *pCVar2;
  
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x48);
  *(Curl_easy **)((long)cf->ctx + 0x48) = data;
  cf_close(cf,data);
  pCVar2 = cf->next;
  if (pCVar2 != (Curl_cfilter *)0x0) {
    (*(code *)pCVar2->cft->do_close)(pCVar2,data);
  }
  *(undefined8 *)((long)cf->ctx + 0x48) = uVar1;
  return;
}

Assistant:

static void ssl_cf_close(struct Curl_cfilter *cf,
                         struct Curl_easy *data)
{
  struct cf_call_data save;

  CF_DATA_SAVE(save, cf, data);
  cf_close(cf, data);
  if(cf->next)
    cf->next->cft->do_close(cf->next, data);
  CF_DATA_RESTORE(cf, save);
}